

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O1

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::on_ssl_handshake_l
          (raw_stream_logic *this,error_code ec)

{
  return;
}

Assistant:

void on_handshake_l(beast::error_code ec) override
			{
				// success
				if (delegate_) {
					auto control_callback = [this](beast::websocket::frame_type kind, boost::string_view payload) {
						delegate_->control_callback(kind, payload);
					};
					raw_stream_->control_callback(control_callback);
					delegate_->on_ready();
				}
			}